

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::name_formatter<spdlog::details::null_scoped_padder>::format
          (name_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  char *__src;
  size_t __n;
  ptrdiff_t _Num;
  ulong uVar1;
  char *buf_ptr;
  
  __src = (msg->logger_name).data_;
  __n = (msg->logger_name).size_;
  uVar1 = (dest->super_buffer<char>).size_ + __n;
  if ((dest->super_buffer<char>).capacity_ < uVar1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar1);
  }
  if (__n != 0) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
  }
  (dest->super_buffer<char>).size_ = uVar1;
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        ScopedPadder p(msg.logger_name.size(), padinfo_, dest);
        fmt_helper::append_string_view(msg.logger_name, dest);
    }